

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testInvalid_NoTrainingInputs(void)

{
  Rep *pRVar1;
  bool bVar2;
  NeuralNetwork *nn;
  ModelDescription *pMVar3;
  ostream *poVar4;
  FeatureDescription *pFVar5;
  FeatureType *this;
  ArrayFeatureType *this_00;
  int iVar6;
  long lVar7;
  void **ppvVar8;
  Model spec;
  FeatureDescription feature;
  Result res;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_e8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_b8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_88;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  
  CoreML::Specification::Model::Model(&spec);
  CoreML::Result::Result(&res);
  tensorAttributesIn.name = "InTensor";
  tensorAttributesIn.dimension = 3;
  tensorAttributesIn._12_4_ = 0;
  tensorAttributesOut.name = "OutTensor";
  tensorAttributesOut.dimension = 1;
  tensorAttributesOut._12_4_ = 0;
  buildBasicNeuralNetworkModel
            (&spec,true,&tensorAttributesIn,&tensorAttributesOut,0x400,false,false);
  spec.specificationversion_ = 4;
  nn = CoreML::Specification::Model::mutable_neuralnetwork(&spec);
  addSoftmaxLayer(&spec,"softmax","OutTensor","softmax_out");
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            (&spec,nn,"cross_entropy_loss_layer","softmax_out","target");
  addLearningRate<CoreML::Specification::NeuralNetwork>(nn,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (nn,kSgdOptimizer,10,5,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_88);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_88);
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl._0_8_ = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  addEpochs<CoreML::Specification::NeuralNetwork>
            (nn,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_b8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_b8);
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl._0_8_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (nn,0x7e3,0,0x7e3,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_e8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_e8);
  pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(pMVar3->traininginput_).super_RepeatedPtrFieldBase);
  CoreML::Model::validate((Result *)&feature,&spec);
  CoreML::Result::operator=(&res,(Result *)&feature);
  std::__cxx11::string::~string((string *)&feature._internal_metadata_);
  bVar2 = CoreML::Result::good(&res);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x56f);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar6 = 1;
  }
  else {
    pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
    pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                       (&pMVar3->traininginput_);
    CoreML::Specification::FeatureDescription::set_name(pFVar5,"target");
    this = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
    this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(this);
    this_00->datatype_ = 0x20020;
    CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
    if (spec.description_ == (ModelDescription *)0x0) {
      spec.description_ =
           (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar1 = ((spec.description_)->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar8 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      ppvVar8 = (void **)0x0;
    }
    iVar6 = ((spec.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar7 = 0; (long)iVar6 * 8 != lVar7; lVar7 = lVar7 + 8) {
      CoreML::Specification::FeatureDescription::FeatureDescription
                (&feature,*(FeatureDescription **)((long)ppvVar8 + lVar7));
      pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
      pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                         (&pMVar3->traininginput_);
      CoreML::Specification::FeatureDescription::CopyFrom(pFVar5,&feature);
      CoreML::Specification::FeatureDescription::~FeatureDescription(&feature);
    }
    CoreML::Model::validate((Result *)&feature,&spec);
    CoreML::Result::operator=(&res,(Result *)&feature);
    std::__cxx11::string::~string((string *)&feature._internal_metadata_);
    bVar2 = CoreML::Result::good(&res);
    iVar6 = 0;
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x57d);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,"(res).good()");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar6 = 1;
    }
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&spec);
  return iVar6;
}

Assistant:

int testInvalid_NoTrainingInputs() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    addCategoricalCrossEntropyLoss(spec, neuralNet, "cross_entropy_loss_layer", "softmax_out", "target");


    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    spec.mutable_description()->clear_traininginput(); // Clearing all training inputs, buildBasicNeuralNetworkModel() adds model inputs to training inputs

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    // Add target and model's inputs to training inputs
    auto trainingInputTarget = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInputTarget->set_name("target");
    auto trainingInputTensorShape = trainingInputTarget->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    for (auto feature : spec.description().input()) {
        auto trainingInputModel = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInputModel->CopyFrom(feature);
    }
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}